

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disas.h
# Opt level: O0

void sh4asm_disas_fxxd_(uint *quads,sh4asm_disas_emit_func em,uint32_t pc)

{
  uint32_t pc_local;
  sh4asm_disas_emit_func em_local;
  uint *quads_local;
  
  switch(quads[1]) {
  case 0:
    sh4asm_txt_fsts_fpul_frn(em,quads[2]);
    break;
  case 1:
    sh4asm_txt_flds_frm_fpul(em,quads[2]);
    break;
  case 2:
    sh4asm_txt_float_fpul_frn(em,quads[2]);
    break;
  case 3:
    sh4asm_txt_ftrc_frm_fpul(em,quads[2]);
    break;
  case 4:
    sh4asm_txt_fneg_frn(em,quads[2]);
    break;
  case 5:
    sh4asm_txt_fabs_frn(em,quads[2]);
    break;
  case 6:
    sh4asm_txt_fsqrt_frn(em,quads[2]);
    break;
  case 7:
    sh4asm_txt_fsrra_frn(em,quads[2]);
    break;
  case 8:
    sh4asm_txt_fldi0_frn(em,quads[2]);
    break;
  case 9:
    sh4asm_txt_fldi1_frn(em,quads[2]);
    break;
  case 10:
    if ((quads[2] & 1) == 0) {
      sh4asm_txt_fcnvsd_fpul_drn(em,quads[2]);
    }
    else {
      sh4asm_opcode_non_inst_(quads,em);
    }
    break;
  case 0xb:
    if ((quads[2] & 1) == 0) {
      sh4asm_txt_fcnvds_drm_fpul(em,quads[2]);
    }
    else {
      sh4asm_opcode_non_inst_(quads,em);
    }
    break;
  default:
    sh4asm_opcode_non_inst_(quads,em);
    break;
  case 0xe:
    sh4asm_txt_fipr_fvm_fvn(em,(quads[2] & 3) << 2,quads[2] & 0xc);
    break;
  case 0xf:
    sh4asm_disas_fxfd_(quads,em,pc);
  }
  return;
}

Assistant:

SH4ASM_STATIC void
sh4asm_disas_fxxd_(unsigned const *quads,
                   sh4asm_disas_emit_func em, uint32_t pc) {
    switch (quads[1]) {
    case 0:
        sh4asm_txt_fsts_fpul_frn(em, quads[2]);
        break;
    case 1:
        sh4asm_txt_flds_frm_fpul(em, quads[2]);
        break;
    case 2:
        sh4asm_txt_float_fpul_frn(em, quads[2]);
        break;
    case 3:
        sh4asm_txt_ftrc_frm_fpul(em, quads[2]);
        break;
    case 4:
        sh4asm_txt_fneg_frn(em, quads[2]);
        break;
    case 5:
        sh4asm_txt_fabs_frn(em, quads[2]);
        break;
    case 6:
        sh4asm_txt_fsqrt_frn(em, quads[2]);
        break;
    case 7:
        sh4asm_txt_fsrra_frn(em, quads[2]);
        break;
    case 8:
        sh4asm_txt_fldi0_frn(em, quads[2]);
        break;
    case 9:
        sh4asm_txt_fldi1_frn(em, quads[2]);
        break;
    case 10:
        // mask is 0xf1ff
        if (!(quads[2] & 1))
            sh4asm_txt_fcnvsd_fpul_drn(em, quads[2]);
        else
            sh4asm_opcode_non_inst_(quads, em);
        break;
    case 11:
        // mask is 0xf1ff
        if (!(quads[2] & 1))
            sh4asm_txt_fcnvds_drm_fpul(em, quads[2]);
        else
            sh4asm_opcode_non_inst_(quads, em);
        break;
    case 14:
        sh4asm_txt_fipr_fvm_fvn(em, (quads[2] & 3) << 2, quads[2] & 12);
        break;
    case 15:
        sh4asm_disas_fxfd_(quads, em, pc);
        break;
    default:
        sh4asm_opcode_non_inst_(quads, em);
    }
}